

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cpp
# Opt level: O3

bool spvtools::opt::ExtInsConflict
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *extIndices,Instruction *insInst
               ,uint32_t extOffset)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  
  lVar4 = (long)(extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start >> 2;
  uVar5 = (insInst->has_result_id_ & 1) + 1;
  if (insInst->has_type_id_ == false) {
    uVar5 = (uint)insInst->has_result_id_;
  }
  uVar5 = ((int)((ulong)((long)(insInst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(insInst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar5
          ) - 2;
  if (lVar4 - (ulong)extOffset == (ulong)uVar5) {
    bVar6 = false;
  }
  else {
    uVar2 = (int)lVar4 - extOffset;
    if (uVar5 < uVar2) {
      uVar2 = uVar5;
    }
    if (uVar2 == 0) {
      bVar6 = true;
    }
    else {
      lVar4 = 0;
      do {
        uVar1 = (extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[extOffset + (int)lVar4];
        uVar5 = (insInst->has_result_id_ & 1) + 1;
        if (insInst->has_type_id_ == false) {
          uVar5 = (uint)insInst->has_result_id_;
        }
        uVar3 = Instruction::GetSingleWordOperand(insInst,uVar5 + (int)lVar4 + 2);
        bVar6 = uVar1 == uVar3;
      } while ((bVar6) && (bVar7 = (ulong)uVar2 - 1 != lVar4, lVar4 = lVar4 + 1, bVar7));
    }
  }
  return bVar6;
}

Assistant:

bool ExtInsConflict(const std::vector<uint32_t>& extIndices,
                    const Instruction* insInst, const uint32_t extOffset) {
  if (extIndices.size() - extOffset == insInst->NumInOperands() - 2)
    return false;
  uint32_t extNumIndices = static_cast<uint32_t>(extIndices.size()) - extOffset;
  uint32_t insNumIndices = insInst->NumInOperands() - 2;
  uint32_t numIndices = std::min(extNumIndices, insNumIndices);
  for (uint32_t i = 0; i < numIndices; ++i)
    if (extIndices[i + extOffset] != insInst->GetSingleWordInOperand(i + 2))
      return false;
  return true;
}